

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Err * parse(VM *vm,int pkg,char *path,char *code)

{
  int iVar1;
  FnScope local_a0;
  Parser psr;
  
  psr.vm = vm;
  lex_new(&psr.lxr,vm,path,code);
  psr.scope = (FnScope *)0x0;
  psr.locals_count = 0;
  psr.locals_capacity = 0x10;
  psr.pkg = pkg;
  psr.locals = (Local *)malloc(0x80);
  vm->err = (Err *)0x0;
  iVar1 = _setjmp((__jmp_buf_tag *)vm->guard);
  if (iVar1 == 0) {
    lex_next(&psr.lxr);
    local_a0.fn = (psr.vm)->pkgs[psr.pkg].main_fn;
    psr.scope = &local_a0;
    local_a0.first_local = 0;
    local_a0.next_slot = 0;
    local_a0.outer_scope = (fn_scope *)0x0;
    parse_block(&psr);
    fn_emit((psr.vm)->fns + (psr.scope)->fn,0x20);
    psr.scope = (FnScope *)0x0;
  }
  free(psr.locals);
  return vm->err;
}

Assistant:

Err * parse(VM *vm, int pkg, char *path, char *code) {
	Parser psr = psr_new(vm, pkg, path, code);

	// Set up an error guard
	vm->err = NULL;
	if (!setjmp(vm->guard)) {
		parse_code(&psr);
	}

	psr_free(&psr);
	return vm->err;
}